

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios_iotest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  key_type *__k;
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr *pp_Var4;
  _Base_ptr *pp_Var5;
  element_type *peVar6;
  pointer pcVar7;
  undefined8 uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  pointer psVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  pointer psVar16;
  size_t sVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  _Rb_tree_color _Var21;
  uint uVar22;
  ostream *poVar23;
  long *plVar24;
  long lVar25;
  mapped_type *pmVar26;
  iterator iVar27;
  mapped_type *pmVar28;
  iterator iVar29;
  mapped_type *pmVar30;
  mapped_type *pmVar31;
  iterator iVar32;
  int *piVar33;
  long lVar34;
  void *pvVar35;
  void *pvVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long *plVar40;
  size_t sVar41;
  element_type *peVar42;
  size_type *psVar43;
  pointer psVar44;
  pointer ppVar45;
  pointer ppVar46;
  ulong uVar47;
  char cVar48;
  _Base_ptr *pp_Var49;
  char *pcVar50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var51;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
  *this_02;
  _Rb_tree_header *p_Var52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  pVar55;
  shared_ptr<Stream> writer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  long local_658;
  string streamName;
  element_type *local_628;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_620;
  ulong local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_610;
  ulong local_600;
  uint local_5f8;
  int argc_local;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
  *local_5f0;
  string __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
  ioMap;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
  streamsInOrder;
  size_t currentConfigLineNumber;
  char **argv_local;
  element_type *local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  element_type *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_550;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  readStreamMap;
  int provided;
  ulong local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  _Rb_tree_node_base local_4e8;
  size_t local_4c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>_>
  local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>_>
  local_490;
  vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> vStack_460;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
  local_448;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
  writeStreamMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  groupMap;
  size_t local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>_>
  local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>_>
  local_380;
  vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> local_350;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
  _Stack_338;
  double local_308;
  double dStack_300;
  Settings settings;
  
  argc_local = argc;
  argv_local = argv;
  Settings::Settings(&settings);
  iVar19 = Settings::processArguments(&settings,argc_local,argv_local);
  iVar20 = 1;
  if (iVar19 == 0) {
    MPI_Init_thread(&argc_local,&argv_local,
                    (uint)settings.multithreadedMPI + (uint)settings.multithreadedMPI * 2,&provided)
    ;
    Settings::initDecomp(&settings,(MPI_Comm)&ompi_mpi_comm_world);
    iVar19 = Settings::extraArgumentChecks(&settings);
    iVar20 = 1;
    if (iVar19 == 0) {
      adios2::ADIOS::ADIOS((ADIOS *)&local_618);
      if (settings.adiosConfigFileName._M_string_length == 0) {
        if (settings.verbose != 0 && settings.myRank == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Use ADIOS without XML configuration ",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
          std::ostream::put('H');
          std::ostream::flush();
        }
        adios2::ADIOS::ADIOS((ADIOS *)&local_4f8,settings.appComm);
        p_Var15 = p_Stack_4f0;
        local_618 = local_4f8;
        p_Var51 = p_Stack_610;
        local_4f8 = 0;
        p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_610 = p_Var15;
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
        }
      }
      else {
        if (settings.verbose != 0 && settings.myRank == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Use ADIOS xml file ",0x13);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,settings.adiosConfigFileName._M_dataplus._M_p,
                               settings.adiosConfigFileName._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
          std::ostream::put((char)poVar23);
          std::ostream::flush();
        }
        adios2::ADIOS::ADIOS
                  ((ADIOS *)&local_4f8,(string *)&settings.adiosConfigFileName,settings.appComm);
        p_Var15 = p_Stack_4f0;
        local_618 = local_4f8;
        p_Var51 = p_Stack_610;
        local_4f8 = 0;
        p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_610 = p_Var15;
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
        }
      }
      if (p_Stack_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f0);
      }
      local_4f8 = 1;
      local_4e8._M_color = _S_red;
      local_4e8._M_parent = (_Base_ptr)0x0;
      local_4c8 = 0;
      p_Var52 = &local_4c0._M_impl.super__Rb_tree_header;
      local_4c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_4c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4c0._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var2 = &local_490._M_impl.super__Rb_tree_header;
      local_490._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_490._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_448._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_448._M_impl.super__Rb_tree_header._M_header;
      local_448._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_448._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_490._M_impl.super__Rb_tree_header._M_node_count = 0;
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_448._M_impl.super__Rb_tree_header._M_node_count = 0;
      currentConfigLineNumber = 0;
      local_4e8._M_left = &local_4e8;
      local_4e8._M_right = &local_4e8;
      local_4c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var52->_M_header;
      local_4c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var52->_M_header;
      local_490._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_490._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      local_448._M_impl.super__Rb_tree_header._M_header._M_right =
           local_448._M_impl.super__Rb_tree_header._M_header._M_left;
      processConfig((Config *)&groupMap,&settings,&currentConfigLineNumber);
      local_4f8 = groupMap._M_t._M_impl._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&p_Stack_4f0);
      if (groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
        pp_Var49 = &groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_4e8._M_color =
             (_Rb_tree_color)groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_4e8._M_parent = groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_4e8._M_left = groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        local_4e8._M_right = (_Base_ptr)groupMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_parent = &local_4e8;
        local_4c8 = local_3b8;
        groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pp_Var49;
        groupMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pp_Var49;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>_>
      ::clear(&local_4c0);
      if (local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var3 = &local_3b0._M_impl.super__Rb_tree_header;
        local_4c0._M_impl.super__Rb_tree_header._M_header._M_color =
             local_3b0._M_impl.super__Rb_tree_header._M_header._M_color;
        local_4c0._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_4c0._M_impl.super__Rb_tree_header._M_header._M_left =
             local_3b0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_4c0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_3b0._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var52->_M_header;
        local_4c0._M_impl.super__Rb_tree_header._M_node_count =
             local_3b0._M_impl.super__Rb_tree_header._M_node_count;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_3b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>_>
      ::clear(&local_490);
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           vStack_460.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           vStack_460.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ioMap._M_t._M_impl._0_8_ =
           vStack_460.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if (local_380._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var52 = &local_380._M_impl.super__Rb_tree_header;
        local_490._M_impl.super__Rb_tree_header._M_header._M_color =
             local_380._M_impl.super__Rb_tree_header._M_header._M_color;
        local_490._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_380._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_490._M_impl.super__Rb_tree_header._M_header._M_left =
             local_380._M_impl.super__Rb_tree_header._M_header._M_left;
        local_490._M_impl.super__Rb_tree_header._M_header._M_right =
             local_380._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_380._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var2->_M_header;
        local_490._M_impl.super__Rb_tree_header._M_node_count =
             local_380._M_impl.super__Rb_tree_header._M_node_count;
        local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_380._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var52->_M_header;
        local_380._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var52->_M_header;
      }
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_350.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_350.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      vStack_460.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_350.
           super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_350.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_350.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_350.
      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::~vector
                ((vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_> *)
                 &ioMap);
      local_5f0 = &local_448;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
      ::clear(local_5f0);
      if (_Stack_338._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var52 = &_Stack_338._M_impl.super__Rb_tree_header;
        local_448._M_impl.super__Rb_tree_header._M_header._M_color =
             _Stack_338._M_impl.super__Rb_tree_header._M_header._M_color;
        local_448._M_impl.super__Rb_tree_header._M_header._M_parent =
             _Stack_338._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_448._M_impl.super__Rb_tree_header._M_header._M_left =
             _Stack_338._M_impl.super__Rb_tree_header._M_header._M_left;
        local_448._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_338._M_impl.super__Rb_tree_header._M_header._M_right;
        (_Stack_338._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &local_448._M_impl.super__Rb_tree_header._M_header;
        local_448._M_impl.super__Rb_tree_header._M_node_count =
             _Stack_338._M_impl.super__Rb_tree_header._M_node_count;
        _Stack_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_338._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_338._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var52->_M_header;
        _Stack_338._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var52->_M_header;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
      ::~_Rb_tree(&_Stack_338);
      std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::~vector
                (&local_350);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>_>
      ::~_Rb_tree(&local_380);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>_>
      ::~_Rb_tree(&local_3b0);
      p_Var52 = &groupMap._M_t._M_impl.super__Rb_tree_header;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)p_Var52);
      MPI_Barrier(settings.appComm);
      dVar10 = (double)MPI_Wtime();
      sVar17 = settings.appId;
      if ((settings.myRank == 0) && (settings.verbose != 0)) {
        cVar48 = '\x01';
        if (9 < settings.appId) {
          sVar41 = settings.appId;
          cVar18 = '\x04';
          do {
            cVar48 = cVar18;
            if (sVar41 < 100) {
              cVar48 = cVar48 + -2;
              goto LAB_00118752;
            }
            if (sVar41 < 1000) {
              cVar48 = cVar48 + -1;
              goto LAB_00118752;
            }
            if (sVar41 < 10000) goto LAB_00118752;
            bVar9 = 99999 < sVar41;
            sVar41 = sVar41 / 10000;
            cVar18 = cVar48 + '\x04';
          } while (bVar9);
          cVar48 = cVar48 + '\x01';
        }
LAB_00118752:
        pp_Var49 = &readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        readStreamMap._M_t._M_impl._0_8_ = pp_Var49;
        std::__cxx11::string::_M_construct((ulong)&readStreamMap,cVar48);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)readStreamMap._M_t._M_impl._0_8_,
                   readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color,sVar17);
        plVar24 = (long *)std::__cxx11::string::replace
                                    ((ulong)&readStreamMap,0,(char *)0x0,0x11dcf1);
        pp_Var4 = &ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar40 = plVar24 + 2;
        if ((long *)*plVar24 == plVar40) {
          ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar40;
          ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar24[3];
          ioMap._M_t._M_impl._0_8_ = pp_Var4;
        }
        else {
          ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar40;
          ioMap._M_t._M_impl._0_8_ = (long *)*plVar24;
        }
        ioMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar24[1];
        *plVar24 = (long)plVar40;
        plVar24[1] = 0;
        *(undefined1 *)(plVar24 + 2) = 0;
        plVar24 = (long *)std::__cxx11::string::append((char *)&ioMap);
        pp_Var5 = &groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar40 = plVar24 + 2;
        if ((long *)*plVar24 == plVar40) {
          groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar40;
          groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar24[3];
          groupMap._M_t._M_impl._0_8_ = pp_Var5;
        }
        else {
          groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar40;
          groupMap._M_t._M_impl._0_8_ = (long *)*plVar24;
        }
        groupMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar24[1];
        *plVar24 = (long)plVar40;
        plVar24[1] = 0;
        *(undefined1 *)(plVar24 + 2) = 0;
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)groupMap._M_t._M_impl._0_8_,
                             groupMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
        std::ostream::put((char)poVar23);
        std::ostream::flush();
        if ((_Base_ptr *)groupMap._M_t._M_impl._0_8_ != pp_Var5) {
          operator_delete((void *)groupMap._M_t._M_impl._0_8_);
        }
        if ((_Base_ptr *)ioMap._M_t._M_impl._0_8_ != pp_Var4) {
          operator_delete((void *)ioMap._M_t._M_impl._0_8_);
        }
        if ((_Base_ptr *)readStreamMap._M_t._M_impl._0_8_ != pp_Var49) {
          operator_delete((void *)readStreamMap._M_t._M_impl._0_8_);
        }
      }
      psVar14 = vStack_460.
                super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           groupMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      streamsInOrder.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var52->_M_header;
      groupMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var52->_M_header;
      if (vStack_460.
          super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          vStack_460.
          super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pp_Var49 = &ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        psVar44 = vStack_460.
                  super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          peVar6 = (psVar44->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar6->op == Read) {
            lVar25 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandRead::typeinfo);
            pmVar26 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&groupMap,(key_type *)(lVar25 + 0x38));
            std::__cxx11::string::_M_assign((string *)pmVar26);
            ioMap._M_t._M_impl._0_8_ = pp_Var49;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&ioMap,*(long *)(lVar25 + 0x38),
                       *(long *)(lVar25 + 0x40) + *(long *)(lVar25 + 0x38));
            ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)
                 CONCAT44(ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,3);
            std::
            vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
            ::emplace_back<std::pair<std::__cxx11::string,Operation>>
                      ((vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
                        *)&streamsInOrder,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                        *)&ioMap);
joined_r0x00118a42:
            if ((_Base_ptr *)ioMap._M_t._M_impl._0_8_ != pp_Var49) {
              operator_delete((void *)ioMap._M_t._M_impl._0_8_);
            }
          }
          else if (peVar6->op == Write) {
            lVar25 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandWrite::typeinfo);
            pmVar26 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&groupMap,(key_type *)(lVar25 + 0x30));
            std::__cxx11::string::_M_assign((string *)pmVar26);
            ioMap._M_t._M_impl._0_8_ = pp_Var49;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&ioMap,*(long *)(lVar25 + 0x30),
                       *(long *)(lVar25 + 0x38) + *(long *)(lVar25 + 0x30));
            ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)
                 CONCAT44(ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,2);
            std::
            vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
            ::emplace_back<std::pair<std::__cxx11::string,Operation>>
                      ((vector<std::pair<std::__cxx11::string,Operation>,std::allocator<std::pair<std::__cxx11::string,Operation>>>
                        *)&streamsInOrder,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>
                        *)&ioMap);
            goto joined_r0x00118a42;
          }
          psVar44 = psVar44 + 1;
        } while (psVar44 != psVar14);
      }
      ppVar46 = streamsInOrder.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &ioMap._M_t._M_impl.super__Rb_tree_header._M_header;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           ioMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           ioMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeStreamMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (streamsInOrder.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          streamsInOrder.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar45 = streamsInOrder.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar7 = (ppVar45->first)._M_dataplus._M_p;
          streamName._M_dataplus._M_p = (pointer)&streamName.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&streamName,pcVar7,pcVar7 + (ppVar45->first)._M_string_length);
          _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pmVar26 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&groupMap,&streamName);
          iVar27 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                   ::find(&ioMap._M_t,pmVar26);
          if ((_Rb_tree_header *)iVar27._M_node == &ioMap._M_t._M_impl.super__Rb_tree_header) {
            createGroup((string *)&writer,(IOLib)pmVar26,(ADIOS *)(ulong)settings.iolib);
            this._M_pi = _Stack_620._M_pi;
            _Stack_620 = writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            local_628 = writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
            }
            if (writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            pmVar28 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
                                    *)&ioMap._M_t,pmVar26);
            (pmVar28->super___shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                 (element_type *)local_628;
            this_00 = &(pmVar28->super___shared_ptr<ioGroup,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount;
            pp_Var49 = (_Base_ptr *)&_Stack_620;
          }
          else {
            local_628 = *(element_type **)(iVar27._M_node + 2);
            pp_Var49 = &iVar27._M_node[2]._M_parent;
            this_00 = &_Stack_620;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)pp_Var49);
          if (ppVar45->second == Write) {
            iVar29 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                     ::find(&writeStreamMap._M_t,&streamName);
            if ((_Rb_tree_header *)iVar29._M_node ==
                &writeStreamMap._M_t._M_impl.super__Rb_tree_header) {
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    Create Output Stream ",0x19);
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,streamName._M_dataplus._M_p,
                                     streamName._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"... ",4);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
                std::ostream::put((char)poVar23);
                std::ostream::flush();
              }
              if (settings.outputPath._M_string_length != 0) {
                writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_668;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&writer,settings.outputPath._M_dataplus._M_p,
                           settings.outputPath._M_dataplus._M_p +
                           settings.outputPath._M_string_length);
                if (settings.outputPath._M_dataplus._M_p[settings.outputPath._M_string_length - 1]
                    != '/') {
                  std::__cxx11::string::push_back((char)&writer);
                }
                std::operator+(&__str_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&writer,&streamName);
                std::__cxx11::string::operator=((string *)&streamName,(string *)&__str_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                  operator_delete(__str_1._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    &local_668) {
                  operator_delete(writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
                }
              }
              local_558 = local_628;
              local_550 = _Stack_620._M_pi;
              if (_Stack_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Stack_620._M_pi)->_M_use_count = (_Stack_620._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Stack_620._M_pi)->_M_use_count = (_Stack_620._M_pi)->_M_use_count + 1;
                }
              }
              openStream((string *)&writer,(shared_ptr<ioGroup> *)&streamName,(Mode)&local_558,1,
                         (MPI_Comm)(ulong)settings.iolib,SUB81(settings.appComm,0),
                         (ulong)settings.ioTimer);
              if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550);
              }
              pmVar30 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                        ::operator[](&writeStreamMap,&ppVar45->first);
              (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount,
                         &writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
              ;
joined_r0x00118f9d:
              if (writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi);
              }
            }
          }
          else {
            iVar29 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                     ::find(&readStreamMap._M_t,&streamName);
            if ((_Rb_tree_header *)iVar29._M_node ==
                &readStreamMap._M_t._M_impl.super__Rb_tree_header) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"    Open Input Stream ",0x16);
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,streamName._M_dataplus._M_p,
                                   streamName._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar23,"... ",4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
              std::ostream::put((char)poVar23);
              std::ostream::flush();
              if (settings.outputPath._M_string_length != 0) {
                writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_668;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&writer,settings.outputPath._M_dataplus._M_p,
                           settings.outputPath._M_dataplus._M_p +
                           settings.outputPath._M_string_length);
                if (settings.outputPath._M_dataplus._M_p[settings.outputPath._M_string_length - 1]
                    != '/') {
                  std::__cxx11::string::push_back((char)&writer);
                }
                std::operator+(&__str_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&writer,&streamName);
                std::__cxx11::string::operator=((string *)&streamName,(string *)&__str_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                  operator_delete(__str_1._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    &local_668) {
                  operator_delete(writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
                }
              }
              local_568 = local_628;
              local_560 = _Stack_620._M_pi;
              if (_Stack_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Stack_620._M_pi)->_M_use_count = (_Stack_620._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Stack_620._M_pi)->_M_use_count = (_Stack_620._M_pi)->_M_use_count + 1;
                }
              }
              openStream((string *)&writer,(shared_ptr<ioGroup> *)&streamName,(Mode)&local_568,2,
                         (MPI_Comm)(ulong)settings.iolib,SUB81(settings.appComm,0),
                         (ulong)settings.ioTimer);
              if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560);
              }
              pmVar30 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                        ::operator[](&readStreamMap,&ppVar45->first);
              (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount,
                         &writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
              ;
              goto joined_r0x00118f9d;
            }
          }
          if (_Stack_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_620._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)streamName._M_dataplus._M_p != &streamName.field_2) {
            operator_delete(streamName._M_dataplus._M_p);
          }
          ppVar45 = ppVar45 + 1;
        } while (ppVar45 != ppVar46);
      }
      local_600 = 1;
      local_658 = 0;
      local_5f8 = 0;
      this_02 = local_5f0;
      do {
        sVar17 = settings.appId;
        ppVar46 = streamsInOrder.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar45 = streamsInOrder.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        psVar14 = vStack_460.
                  super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar44 = vStack_460.
                  super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (settings.myRank == 0) {
          cVar48 = '\x01';
          if (9 < settings.appId) {
            sVar41 = settings.appId;
            cVar18 = '\x04';
            do {
              cVar48 = cVar18;
              if (sVar41 < 100) {
                cVar48 = cVar48 + -2;
                goto LAB_00119070;
              }
              if (sVar41 < 1000) {
                cVar48 = cVar48 + -1;
                goto LAB_00119070;
              }
              if (sVar41 < 10000) goto LAB_00119070;
              bVar9 = 99999 < sVar41;
              sVar41 = sVar41 / 10000;
              cVar18 = cVar48 + '\x04';
            } while (bVar9);
            cVar48 = cVar48 + '\x01';
          }
LAB_00119070:
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_1,cVar48);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,sVar17);
          plVar24 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x11de3e);
          peVar42 = (element_type *)(plVar24 + 2);
          if ((element_type *)*plVar24 == peVar42) {
            local_668._M_allocated_capacity = (size_type)peVar42->_vptr_Stream;
            local_668._8_8_ = plVar24[3];
            writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_668;
          }
          else {
            local_668._M_allocated_capacity = (size_type)peVar42->_vptr_Stream;
            writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar24;
          }
          writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar24[1];
          *plVar24 = (long)peVar42;
          plVar24[1] = 0;
          *(undefined1 *)(plVar24 + 2) = 0;
          plVar24 = (long *)std::__cxx11::string::append((char *)&writer);
          psVar43 = (size_type *)(plVar24 + 2);
          if ((size_type *)*plVar24 == psVar43) {
            streamName.field_2._M_allocated_capacity = *psVar43;
            streamName.field_2._8_8_ = plVar24[3];
            streamName._M_dataplus._M_p = (pointer)&streamName.field_2;
          }
          else {
            streamName.field_2._M_allocated_capacity = *psVar43;
            streamName._M_dataplus._M_p = (pointer)*plVar24;
          }
          streamName._M_string_length = plVar24[1];
          *plVar24 = (long)psVar43;
          plVar24[1] = 0;
          *(undefined1 *)(plVar24 + 2) = 0;
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,streamName._M_dataplus._M_p,
                               streamName._M_string_length);
          poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,": ",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
          std::ostream::put((char)poVar23);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)streamName._M_dataplus._M_p != &streamName.field_2) {
            operator_delete(streamName._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_668)
          {
            operator_delete(writer.super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          ppVar46 = streamsInOrder.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar45 = streamsInOrder.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar14 = vStack_460.
                    super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar44 = vStack_460.
                    super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
            operator_delete(__str_1._M_dataplus._M_p);
            ppVar46 = streamsInOrder.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar45 = streamsInOrder.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            psVar14 = vStack_460.
                      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar44 = vStack_460.
                      super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (; psVar16 = vStack_460.
                         super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            streamsInOrder.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
            ._M_impl.super__Vector_impl_data._M_start = ppVar46,
            streamsInOrder.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar45,
            psVar14 !=
            vStack_460.
            super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; psVar14 = psVar14 + 1) {
          peVar6 = (psVar14->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          vStack_460.
          super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = psVar44;
          if (((peVar6->conditionalStream)._M_string_length == 0) ||
             (pmVar31 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                        ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                              *)this_02,&peVar6->conditionalStream), *pmVar31 == OK)) {
            peVar6 = (psVar14->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            switch(peVar6->op) {
            case Sleep:
              lVar25 = std::chrono::_V2::system_clock::now();
              adios2::ADIOS::EnterComputationBlock();
              peVar6 = (psVar14->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (peVar6 == (element_type *)0x0) {
                lVar34 = 0;
              }
              else {
                lVar34 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandSleep::typeinfo,0);
              }
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                uVar8 = *(undefined8 *)(lVar34 + 0x30);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    Sleep for ",0xe);
                auVar53._8_4_ = (int)((ulong)uVar8 >> 0x20);
                auVar53._0_8_ = uVar8;
                auVar53._12_4_ = 0x45300000;
                poVar23 = std::ostream::_M_insert<double>
                                    (((auVar53._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0))
                                     / 1000000.0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"  seconds ",10);
              }
              uVar47 = *(ulong *)(lVar34 + 0x30);
              if (0 < (long)uVar47) {
                streamName._M_dataplus._M_p = (pointer)(uVar47 / 1000000);
                streamName._M_string_length = (uVar47 % 1000000) * 1000;
                do {
                  iVar20 = nanosleep((timespec *)&streamName,(timespec *)&streamName);
                  if (iVar20 != -1) break;
                  piVar33 = __errno_location();
                } while (*piVar33 == 4);
              }
              adios2::ADIOS::ExitComputationBlock();
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                lVar34 = std::chrono::_V2::system_clock::now();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout," -> Slept for ",0xe);
                poVar23 = std::ostream::_M_insert<double>((double)(lVar34 - lVar25) / 1000000000.0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"  seconds ",10);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
                std::ostream::put((char)poVar23);
                std::ostream::flush();
              }
              break;
            case Busy:
              if (peVar6 == (element_type *)0x0) {
                lVar25 = 0;
              }
              else {
                lVar25 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandBusy::typeinfo);
              }
              lVar34 = std::chrono::_V2::system_clock::now();
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                dStack_300 = (double)CONCAT44(0x45300000,
                                              (int)((ulong)*(undefined8 *)(lVar25 + 0x38) >> 0x20))
                             - 1.9342813113834067e+25;
                local_308 = (dStack_300 +
                            ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(lVar25 + 0x38)) -
                            4503599627370496.0)) / 1000000.0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    Busy for ",0xd);
                poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," cycles with ",0xd);
                poVar23 = std::ostream::_M_insert<double>(local_308);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar23," seconds work in each cycle",0x1b);
              }
              pvVar35 = calloc(0x100000,8);
              pvVar36 = malloc(0x800000);
              if (*(long *)(lVar25 + 0x30) != 0) {
                uVar47 = 0;
                do {
                  lVar37 = std::chrono::_V2::system_clock::now();
                  lVar38 = *(long *)(lVar25 + 0x38);
                  if (lVar38 != 0) {
                    adios2::ADIOS::EnterComputationBlock();
                  }
                  lVar37 = lVar38 * 1000 + lVar37;
                  lVar38 = std::chrono::_V2::system_clock::now();
                  if (lVar38 < lVar37) {
                    lVar38 = 0;
                    do {
                      do {
                        pdVar1 = (double *)((long)pvVar35 + lVar38 * 8);
                        dVar13 = *pdVar1;
                        dVar11 = pdVar1[1];
                        dVar11 = dVar11 + dVar11 + 1e-06;
                        auVar12._8_4_ = SUB84(dVar11,0);
                        auVar12._0_8_ = dVar13 + dVar13 + 1e-06;
                        auVar12._12_4_ = (int)((ulong)dVar11 >> 0x20);
                        *(undefined1 (*) [16])((long)pvVar35 + lVar38 * 8) = auVar12;
                        lVar38 = lVar38 + 2;
                      } while (lVar38 != 0x100000);
                      lVar39 = std::chrono::_V2::system_clock::now();
                      lVar38 = 0;
                    } while (lVar39 < lVar37);
                  }
                  if (*(long *)(lVar25 + 0x38) != 0) {
                    adios2::ADIOS::ExitComputationBlock();
                  }
                  MPI_Allreduce(pvVar35,pvVar36,0x100000,&ompi_mpi_double,&ompi_mpi_op_sum,
                                settings.appComm);
                  uVar47 = uVar47 + 1;
                } while (uVar47 < *(ulong *)(lVar25 + 0x30));
              }
              lVar25 = std::chrono::_V2::system_clock::now();
              this_02 = local_5f0;
              local_658 = local_658 + (lVar25 - lVar34) / 1000;
              if ((settings.myRank == 0) && (settings.verbose != 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout," -> Was busy for ",0x11);
                poVar23 = std::ostream::_M_insert<double>((double)(lVar25 - lVar34) / 1000000000.0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"  seconds ",10);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
                std::ostream::put((char)poVar23);
                std::ostream::flush();
              }
              break;
            case Write:
              lVar25 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandWrite::typeinfo,0);
              pmVar30 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                        ::operator[](&writeStreamMap,(key_type *)(lVar25 + 0x30));
              peVar42 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              p_Var51 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
              if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                }
              }
              (*peVar42->_vptr_Stream[2])(peVar42,lVar25,&local_4f8,&settings,local_600);
              goto LAB_00119827;
            case Read:
              lVar25 = __dynamic_cast(peVar6,&Command::typeinfo,&CommandRead::typeinfo,0);
              __k = (key_type *)(lVar25 + 0x38);
              iVar32 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
                       ::find(this_02,__k);
              if (iVar32._M_node[2]._M_color < 2) {
                pmVar30 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                          ::operator[](&readStreamMap,__k);
                peVar42 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                p_Var51 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi;
                if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                  }
                }
                _Var21 = (*peVar42->_vptr_Stream[3])(peVar42,lVar25,&local_4f8,&settings,local_600);
                iVar32._M_node[2]._M_color = _Var21;
                if (_Var21 + ~_S_black < 2) {
                  pVar55 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                          *)&p_Stack_4f0,__k);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  *)&p_Stack_4f0,(_Base_ptr)pVar55.first._M_node,
                                 (_Base_ptr)pVar55.second._M_node);
                  if (settings.myRank == 0) {
                    lVar25 = 0x28;
                    pcVar50 = "    Nonblocking read status: Terminated ";
joined_r0x00119947:
                    if (settings.verbose != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar50,lVar25);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
                      std::ostream::put('H');
                      std::ostream::flush();
                    }
                  }
                }
                else if ((_Var21 == _S_black) && (settings.myRank == 0)) {
                  lVar25 = 0x27;
                  pcVar50 = "    Nonblocking read status: Not Ready ";
                  goto joined_r0x00119947;
                }
LAB_00119827:
                if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
                }
              }
            }
            if ((settings.myRank == 0) && (settings.verbose != 0)) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
              std::ostream::put('H');
              std::ostream::flush();
            }
          }
          else if ((settings.myRank == 0) && (settings.verbose != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Skip command because of status of stream ",0x2d);
            peVar6 = (psVar14->super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(peVar6->conditionalStream)._M_dataplus._M_p,
                                 (peVar6->conditionalStream)._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
          }
          ppVar46 = streamsInOrder.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar45 = streamsInOrder.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar44 = vStack_460.
                    super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          vStack_460.
          super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = psVar16;
        }
        uVar22 = local_5f8 & 0xff;
        local_5f8 = 1;
        if (local_600 < local_4f8) {
          local_5f8 = uVar22;
        }
        if (local_4c8 != 0) {
          local_5f8 = uVar22;
        }
        local_600 = local_600 + 1;
        vStack_460.
        super__Vector_base<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = psVar44;
      } while ((local_5f8 & 1) == 0);
      if (ppVar46 != ppVar45) {
        do {
          if (ppVar46->second == Write) {
            iVar29 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                     ::find(&writeStreamMap._M_t,&ppVar46->first);
            if ((_Rb_tree_header *)iVar29._M_node !=
                &writeStreamMap._M_t._M_impl.super__Rb_tree_header) {
              pmVar30 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                                      *)&writeStreamMap._M_t,&ppVar46->first);
              p_Var51 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
              if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                }
              }
              (**(code **)(**(long **)(iVar29._M_node + 2) + 0x20))();
              this_01 = &writeStreamMap._M_t;
LAB_00119ab0:
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
              ::_M_erase_aux(this_01,(const_iterator)iVar29._M_node);
              if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
              }
            }
          }
          else {
            iVar29 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                     ::find(&readStreamMap._M_t,&ppVar46->first);
            if ((_Rb_tree_header *)iVar29._M_node !=
                &readStreamMap._M_t._M_impl.super__Rb_tree_header) {
              pmVar30 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
                                      *)&readStreamMap._M_t,&ppVar46->first);
              p_Var51 = (pmVar30->super___shared_ptr<Stream,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
              if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                }
              }
              (**(code **)(**(long **)(iVar29._M_node + 2) + 0x20))();
              this_01 = &readStreamMap._M_t;
              goto LAB_00119ab0;
            }
          }
          ppVar46 = ppVar46 + 1;
        } while (ppVar46 != ppVar45);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~_Rb_tree(&writeStreamMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Stream>_>_>_>
      ::~_Rb_tree(&readStreamMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ioGroup>_>_>_>
      ::~_Rb_tree(&ioMap._M_t);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Operation>_>_>
      ::~vector(&streamsInOrder);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&groupMap._M_t);
      MPI_Barrier(settings.appComm);
      dVar11 = (double)MPI_Wtime();
      if (settings.myRank == 0) {
        if (local_658 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Total Busy time on Rank 0 was ",0x20);
          auVar54._0_8_ = (double)CONCAT44(0x43300000,(int)local_658);
          auVar54._8_4_ = (int)((ulong)local_658 >> 0x20);
          auVar54._12_4_ = 0x45300000;
          poVar23 = std::ostream::_M_insert<double>
                              (((auVar54._8_8_ - 1.9342813113834067e+25) +
                               (auVar54._0_8_ - 4503599627370496.0)) / 1000000.0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," seconds ",9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
          std::ostream::put((char)poVar23);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ADIOS IOTEST App ",0x11);
        poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23," total time ",0xc);
        poVar23 = std::ostream::_M_insert<double>(dVar11 - dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23," seconds ",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
        std::ostream::put((char)poVar23);
        std::ostream::flush();
      }
      MPI_Finalize();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::StepStatus>_>_>
      ::~_Rb_tree(&local_448);
      std::vector<std::shared_ptr<Command>,_std::allocator<std::shared_ptr<Command>_>_>::~vector
                (&vStack_460);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>_>_>_>
      ::~_Rb_tree(&local_490);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>_>_>_>
      ::~_Rb_tree(&local_4c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)&p_Stack_4f0);
      iVar20 = 0;
      if (p_Stack_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_610);
        iVar20 = 0;
      }
    }
  }
  Settings::~Settings(&settings);
  return iVar20;
}

Assistant:

int main(int argc, char *argv[])
{
    Settings settings;

    /* Check input arguments. Quit if something is wrong. */
    if (settings.processArguments(argc, argv))
    {
        return 1;
    }

    int provided;
    int threadSupportLevel = MPI_THREAD_SINGLE;
    if (settings.multithreadedMPI)
    {
        threadSupportLevel = MPI_THREAD_MULTIPLE;
    }
    MPI_Init_thread(&argc, &argv, threadSupportLevel, &provided);

    settings.initDecomp(MPI_COMM_WORLD);

    // MPI-dependent argument checks
    if (settings.extraArgumentChecks())
    {
        return 1;
    }

    adios2::ADIOS adios;
    if (settings.adiosConfigFileName.empty())
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS without XML configuration " << std::endl;
        }
        adios = adios2::ADIOS(settings.appComm);
    }
    else
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Use ADIOS xml file " << settings.adiosConfigFileName << std::endl;
        }
        adios = adios2::ADIOS(settings.adiosConfigFileName, settings.appComm);
    }
    Config cfg;
    size_t currentConfigLineNumber = 0;

    try
    {
        cfg = processConfig(settings, &currentConfigLineNumber);
    }
    catch (std::invalid_argument &e) // config file processing errors
    {
        if (!settings.myRank)
        {
            if (!currentConfigLineNumber)
            {
                std::cout << "Config file error: " << e.what() << std::endl;
            }
            else
            {
                std::cout << "Config file error in line " << currentConfigLineNumber << ": "
                          << e.what() << std::endl;
            }
        }

        /* Quit calmly */
        MPI_Finalize();
        return 1;
    }

    double timeStart, timeEnd;
    MPI_Barrier(settings.appComm);
    timeStart = MPI_Wtime();

    uint64_t actualBusyTime_usec = 0;

    try
    {
        /* writing to one stream using two groups is not supported.
         * FIXME: we need to check for this condition and raise error
         */
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "Start App " + std::to_string(settings.appId) + ": " << std::endl;
        }
        /* 1. Assign stream names with group names that appear in
           commands */
        // map of <streamName, groupName>
        std::map<std::string, std::string> groupMap;
        // a vector of streams in the order they appear
        std::vector<std::pair<std::string, Operation>> streamsInOrder;
        for (const auto &cmd : cfg.commands)
        {
            if (cmd->op == Operation::Write)
            {
                auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                groupMap[cmdW->streamName] = cmdW->groupName;
                streamsInOrder.push_back(std::make_pair(cmdW->streamName, Operation::Write));
            }
            else if (cmd->op == Operation::Read)
            {
                auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                groupMap[cmdR->streamName] = cmdR->groupName;
                streamsInOrder.push_back(std::make_pair(cmdR->streamName, Operation::Read));
            }
        }

        std::map<std::string, std::shared_ptr<ioGroup>> ioMap;

        /* 2. Declare/define groups and open streams in the order they
         * appear */
        std::map<std::string, std::shared_ptr<Stream>> readStreamMap;
        std::map<std::string, std::shared_ptr<Stream>> writeStreamMap;

        for (const auto &st : streamsInOrder)
        {
            std::string streamName = st.first;
            std::shared_ptr<ioGroup> io;
            auto &groupName = groupMap[streamName];
            auto it = ioMap.find(groupName);
            if (it == ioMap.end())
            {
                io = createGroup(groupName, settings.iolib, adios);
                ioMap[groupName] = io;
            }
            else
            {
                io = it->second;
            }
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto it = writeStreamMap.find(streamName);
                if (it == writeStreamMap.end())
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Create Output Stream " << streamName << "... "
                                  << std::endl;
                    }
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> writer =
                        openStream(streamName, io, adios2::Mode::Write, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    writeStreamMap[st.first] = writer;
                }
            }
            else /* Read */
            {
                auto it = readStreamMap.find(streamName);
                if (it == readStreamMap.end())
                {
                    std::cout << "    Open Input Stream " << streamName << "... " << std::endl;
                    if (!settings.outputPath.empty())
                    {
                        std::string outputPath = settings.outputPath;
                        if (settings.outputPath.back() != '/')
                        {
                            outputPath += '/';
                        }

                        streamName = outputPath + streamName;
                    }
                    std::shared_ptr<Stream> reader =
                        openStream(streamName, io, adios2::Mode::Read, settings.iolib,
                                   settings.appComm, settings.ioTimer, settings.appId);
                    readStreamMap[st.first] = reader;
                }
            }
        }

        /* Execute commands */
        bool exitLoop = false;
        size_t step = 1;
        while (!exitLoop)
        {
            if (!settings.myRank)
            {
                std::cout << "App " + std::to_string(settings.appId) + " Step " << step << ": "
                          << std::endl;
            }
            for (const auto &cmd : cfg.commands)
            {
                if (!cmd->conditionalStream.empty() &&
                    cfg.condMap.at(cmd->conditionalStream) != adios2::StepStatus::OK)
                {
                    if (!settings.myRank && settings.verbose)
                    {
                        std::cout << "    Skip command because of status "
                                     "of stream "
                                  << cmd->conditionalStream << std::endl;
                    }
                    continue;
                }

                switch (cmd->op)
                {
                case Operation::Sleep: {
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    adios.EnterComputationBlock();
                    auto cmdS = dynamic_cast<const CommandSleep *>(cmd.get());
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->sleepTime_us) / 1000000.0;
                        std::cout << "    Sleep for " << t << "  seconds ";
                    }
                    std::this_thread::sleep_for(std::chrono::microseconds(cmdS->sleepTime_us));
                    adios.ExitComputationBlock();
                    if (!settings.myRank && settings.verbose)
                    {
                        std::chrono::high_resolution_clock::time_point end =
                            std::chrono::high_resolution_clock::now();
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Slept for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Busy: {
                    auto cmdS = dynamic_cast<const CommandBusy *>(cmd.get());
                    std::chrono::high_resolution_clock::time_point start =
                        std::chrono::high_resolution_clock::now();
                    // auto sleeptime =
                    //     std::chrono::microseconds(cmdS->busyTime_us);
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>(cmdS->busyTime_us) / 1000000.0;
                        std::cout << "    Busy for " << cmdS->cycles << " cycles with " << t
                                  << " seconds work in each cycle";
                    }
                    const size_t N = 1048576;
                    double *f = (double *)calloc(N, sizeof(double));
                    double *g = (double *)malloc(N * sizeof(double));
                    for (size_t c = 0; c < cmdS->cycles; ++c)
                    {
                        auto end = std::chrono::high_resolution_clock::now() +
                                   std::chrono::microseconds(cmdS->busyTime_us);
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.EnterComputationBlock();
                        }
                        while (std::chrono::high_resolution_clock::now() < end)
                        {
                            for (size_t i = 0; i < N; ++i)
                            {
                                f[i] = f[i] * 2.0 + 0.000001;
                            }
                        }
                        if (cmdS->busyTime_us > 0.1)
                        {
                            adios.ExitComputationBlock();
                        }
                        MPI_Allreduce(f, g, N, MPI_DOUBLE, MPI_SUM, settings.appComm);
                    }
                    std::chrono::high_resolution_clock::time_point end =
                        std::chrono::high_resolution_clock::now();
                    actualBusyTime_usec += (end - start).count() / 1000;
                    if (!settings.myRank && settings.verbose)
                    {
                        double t = static_cast<double>((end - start).count()) / 1000000000.0;
                        std::cout << " -> Was busy for " << t << "  seconds " << std::endl;
                    }
                    break;
                }
                case Operation::Write: {
                    auto cmdW = dynamic_cast<CommandWrite *>(cmd.get());
                    auto stream = writeStreamMap[cmdW->streamName];
                    // auto io = ioMap[cmdW->groupName];
                    stream->Write(cmdW, cfg, settings, step);
                    break;
                }
                case Operation::Read: {
                    auto cmdR = dynamic_cast<CommandRead *>(cmd.get());
                    auto statusIt = cfg.condMap.find(cmdR->streamName);
                    if (statusIt->second == adios2::StepStatus::OK ||
                        statusIt->second == adios2::StepStatus::NotReady)
                    {
                        auto stream = readStreamMap[cmdR->streamName];
                        // auto io = ioMap[cmdR->groupName];
                        adios2::StepStatus status = stream->Read(cmdR, cfg, settings, step);
                        statusIt->second = status;
                        switch (status)
                        {
                        case adios2::StepStatus::OK:
                            break;
                        case adios2::StepStatus::NotReady:
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Not Ready "
                                          << std::endl;
                            }
                            break;
                        case adios2::StepStatus::EndOfStream:
                        case adios2::StepStatus::OtherError:
                            cfg.stepOverStreams.erase(cmdR->streamName);
                            if (!settings.myRank && settings.verbose)
                            {
                                std::cout << "    Nonblocking read status: "
                                             "Terminated "
                                          << std::endl;
                            }
                            break;
                        }
                    }
                    break;
                }
                }
                if (!settings.myRank && settings.verbose)
                {
                    std::cout << std::endl;
                }
            }
            if (!cfg.stepOverStreams.size() && step >= cfg.nSteps)
            {
                exitLoop = true;
            }
            ++step;
        }

        /* Close all streams in order of opening */
        for (const auto &st : streamsInOrder)
        {
            const std::string &streamName = st.first;
            const bool isWrite = (st.second == Operation::Write);
            if (isWrite)
            {
                auto writerIt = writeStreamMap.find(streamName);
                if (writerIt != writeStreamMap.end())
                {
                    auto writer = writeStreamMap[streamName];
                    writerIt->second->Close();
                    writeStreamMap.erase(writerIt);
                }
            }
            else /* Read */
            {
                auto readerIt = readStreamMap.find(streamName);
                if (readerIt != readStreamMap.end())
                {
                    auto reader = readStreamMap[streamName];
                    readerIt->second->Close();
                    readStreamMap.erase(readerIt);
                }
            }
        }
    }
    catch (std::exception &e) // if some unknown error occurs
    {
        if (!settings.myRank)
        {
            std::cout << "ADIOS " << e.what() << std::endl;
        }

        /* Yell and quit */
        MPI_Abort(settings.appComm, -1);
    }

    MPI_Barrier(settings.appComm);
    timeEnd = MPI_Wtime();
    if (!settings.myRank)
    {
        if (actualBusyTime_usec > 0)
        {
            std::cout << "  Total Busy time on Rank 0 was "
                      << (double)actualBusyTime_usec / 1000000.0 << " seconds " << std::endl;
        }
        std::cout << "ADIOS IOTEST App " << settings.appId << " total time " << timeEnd - timeStart
                  << " seconds " << std::endl;
    }

    MPI_Finalize();
    return 0;
}